

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O2

void __thiscall sc_core::sc_event_list::add_dynamic(sc_event_list *this,sc_thread_handle thread_h)

{
  long lVar1;
  ulong uVar2;
  sc_event **l_events;
  
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  lVar1 = *(long *)this;
  uVar2 = *(long *)(this + 8) - lVar1;
  if (uVar2 != 0) {
    uVar2 = uVar2 >> 3 & 0xffffffff;
    while( true ) {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) break;
      sc_event::add_dynamic(*(sc_event **)(lVar1 + (ulong)((uint)uVar2 & 0x7fffffff) * 8),thread_h);
    }
  }
  return;
}

Assistant:

void
sc_event_list::add_dynamic( sc_thread_handle thread_h ) const
{
    m_busy++;
    if ( m_events.size() != 0 ) {
      const sc_event* const* l_events = &m_events[0];
      for( int i = m_events.size() - 1; i >= 0; -- i ) {
          l_events[i]->add_dynamic( thread_h );
      }
  }
}